

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Watcher.cpp
# Opt level: O0

void __thiscall efsw::Watcher::Watcher(Watcher *this)

{
  allocator local_11;
  Watcher *local_10;
  Watcher *this_local;
  
  this->_vptr_Watcher = (_func_int **)&PTR__Watcher_00184bb0;
  this->ID = 0;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->Directory,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->Listener = (FileWatchListener *)0x0;
  this->Recursive = false;
  std::__cxx11::string::string((string *)&this->OldFileName);
  return;
}

Assistant:

Watcher::Watcher() : ID( 0 ), Directory( "" ), Listener( NULL ), Recursive( false ) {}